

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baggage_types.cpp
# Opt level: O3

void __thiscall
jaegertracing::thrift::BaggageRestriction::BaggageRestriction
          (BaggageRestriction *this,BaggageRestriction *other0)

{
  *(undefined ***)this = &PTR__BaggageRestriction_00273e98;
  (this->baggageKey)._M_dataplus._M_p = (pointer)&(this->baggageKey).field_2;
  (this->baggageKey)._M_string_length = 0;
  (this->baggageKey).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->baggageKey);
  this->maxValueLength = other0->maxValueLength;
  return;
}

Assistant:

BaggageRestriction::BaggageRestriction(const BaggageRestriction& other0) {
  baggageKey = other0.baggageKey;
  maxValueLength = other0.maxValueLength;
}